

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.cpp
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ProcessORow::operator()
          (ProcessORow *this,iterator_t *str,iterator_t end)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  ObservationModelDiscrete *pOVar5;
  bool bVar6;
  ulong uVar7;
  ulong uVar8;
  ParserPOMDPFormat_Spirit *pPVar9;
  ostream *poVar10;
  E *pEVar11;
  uint *puVar12;
  uint uVar13;
  uint *puVar14;
  vector<double,_std::allocator<double>_> row;
  stringstream ss;
  ostream local_1a8 [376];
  
  pPVar9 = this->_m_po;
  if ((long)(pPVar9->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(pPVar9->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start != 4) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar10 = std::operator<<(local_1a8,"ProcessORow:_m_lp_fromSI has size != 1. (at ");
    poVar10 = POMDPFormatParsing::operator<<(poVar10,&str->_pos);
    poVar10 = std::operator<<(poVar10,")");
    std::endl<char,std::char_traits<char>>(poVar10);
    pEVar11 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar11,&ss);
    __cxa_throw(pEVar11,&E::typeinfo,E::~E);
  }
  bVar6 = IsRowMatrixLP(pPVar9);
  if (bVar6) {
    std::vector<double,_std::allocator<double>_>::vector
              (&row,(this->_m_po->_m_curMatrix).
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    uVar7 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscrete.
                                   super_MultiAgentDecisionProcess + 0x30))();
    uVar8 = (**(code **)(*(long *)&(this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                                   super_MultiAgentDecisionProcessDiscrete.
                                   super_MultiAgentDecisionProcess + 0xd0))();
    if ((long)row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start >> 3 == uVar8) {
      pPVar9 = this->_m_po;
      puVar12 = (pPVar9->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*puVar12 == pPVar9->_m_anyStateIndex) {
        if ((pPVar9->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish != puVar12) {
          (pPVar9->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar12;
        }
        for (_ss = 0; _ss < uVar7; _ss = _ss + 1) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this->_m_po->_m_lp_toSI,(value_type_conflict1 *)&ss);
        }
        pPVar9 = this->_m_po;
        puVar12 = (pPVar9->_m_lp_toSI).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start;
      }
      puVar3 = (pPVar9->_m_lp_toSI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (; puVar12 != puVar3; puVar12 = puVar12 + 1) {
        uVar1 = *puVar12;
        puVar4 = (this->_m_po->_m_lp_JAI).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (puVar14 = (this->_m_po->_m_lp_JAI).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start; puVar14 != puVar4; puVar14 = puVar14 + 1) {
          uVar2 = *puVar14;
          for (uVar13 = 0; uVar7 = (ulong)uVar13, uVar7 < uVar8; uVar13 = uVar13 + 1) {
            pOVar5 = (this->_m_po->_m_decPOMDPDiscrete->super_DecPOMDPDiscrete).
                     super_MultiAgentDecisionProcessDiscrete._m_p_oModel;
            (*(pOVar5->super_ObservationModelDiscreteInterface).super_ObservationModel.
              _vptr_ObservationModel[6])
                      (row.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar7],pOVar5,(ulong)uVar2,(ulong)uVar1,
                       uVar7);
          }
        }
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&row.super__Vector_base<double,_std::allocator<double>_>);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar10 = std::operator<<(local_1a8,"ProcessORow: exected a row matrix with nrJO=");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10," entries. Found ");
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    poVar10 = std::operator<<(poVar10," entries. (at ");
    poVar10 = POMDPFormatParsing::operator<<(poVar10,&str->_pos);
    poVar10 = std::operator<<(poVar10,")");
    std::endl<char,std::char_traits<char>>(poVar10);
    pEVar11 = (E *)__cxa_allocate_exception(0x28);
    E::E(pEVar11,&ss);
    __cxa_throw(pEVar11,&E::typeinfo,E::~E);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar10 = std::operator<<(local_1a8,"ProcessORow: a row matrix should have been parsed. (at ");
  poVar10 = POMDPFormatParsing::operator<<(poVar10,&str->_pos);
  poVar10 = std::operator<<(poVar10,")");
  std::endl<char,std::char_traits<char>>(poVar10);
  pEVar11 = (E *)__cxa_allocate_exception(0x28);
  E::E(pEVar11,&ss);
  __cxa_throw(pEVar11,&E::typeinfo,E::~E);
}

Assistant:

void ParserPOMDPFormat_Spirit::ProcessORow::operator()(iterator_t str, iterator_t end) const
{
    if( _m_po->_m_lp_toSI.size() != 1 )
    {
        stringstream ss; ss<<"ProcessORow:_m_lp_fromSI has size != 1. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( !_m_po->IsRowMatrixLP() )
    {
        stringstream ss; ss<<"ProcessORow: a row matrix should have been parsed. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    vector<double> row = _m_po->_m_curMatrix[0];
    size_t nrS = _m_po->GetPOMDPDiscrete()->GetNrStates();
    size_t nrJO = _m_po->GetPOMDPDiscrete()->GetNrJointObservations();
    if( row.size() != nrJO)
    {
        stringstream ss; ss<<"ProcessORow: exected a row matrix with nrJO="<<nrJO<<" entries. Found "<<row.size()<< " entries. (at " <<str.get_position()<<")"<<endl; throw E(ss);
    }
    if( _m_po->_m_lp_toSI[0] == _m_po->_m_anyStateIndex )
    {
        _m_po->_m_lp_toSI.clear();
        for(Index si=0; si < nrS; si++)
            _m_po->_m_lp_toSI.push_back(si);
    }    
    vector<Index>::iterator sI_it = _m_po->_m_lp_toSI.begin();
    vector<Index>::iterator sI_last = _m_po->_m_lp_toSI.end();
    while(sI_it != sI_last)
    {
        Index sucSI = *sI_it;
        vector<Index>::iterator jaI_it = _m_po->_m_lp_JAI.begin();
        vector<Index>::iterator jaI_last = _m_po->_m_lp_JAI.end();
        while(jaI_it != jaI_last)
        {
            Index jaI = *jaI_it;
            for(Index joI=0; joI < nrJO; joI++)
            {
                _m_po->GetPOMDPDiscrete()->SetObservationProbability
                    (jaI, sucSI, joI, row[joI]);
                if(DEBUG_POMDP_PARSE)
                    cout << "Setting O("<<jaI<<","<<sucSI<<","<<joI<< ") = "<<row[joI]<<endl;
            }
            jaI_it++;
        }
        sI_it++;
    }
}